

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_braid_c.c
# Opt level: O2

uint32_t crc32_braid(uint32_t crc,uint8_t *buf,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  ulong *puVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint32_t uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar9 = ~crc;
  puVar5 = (ulong *)buf;
  if (0x2e < len) {
    for (; (len != 0 && (((ulong)buf & 7) != 0)); buf = buf + 1) {
      uVar9 = uVar9 >> 8 ^ crc_table[(byte)((byte)*puVar5 ^ (byte)uVar9)];
      len = len - 1;
      puVar5 = (ulong *)((long)puVar5 + 1);
    }
    uVar14 = 0;
    uVar1 = len / 0x28;
    uVar11 = (ulong)uVar9;
    uVar16 = 0;
    uVar7 = 0;
    uVar13 = 0;
    while (uVar1 = uVar1 - 1, uVar1 != 0) {
      uVar4 = uVar11 ^ *puVar5;
      uVar12 = uVar14 ^ puVar5[1];
      uVar8 = uVar16 ^ puVar5[2];
      uVar2 = uVar7 ^ puVar5[3];
      uVar15 = uVar13 ^ puVar5[4];
      uVar11 = (ulong)crc_braid_table[0][(uint)uVar4 & 0xff];
      uVar14 = (ulong)crc_braid_table[0][(uint)uVar12 & 0xff];
      uVar16 = (ulong)crc_braid_table[0][(uint)uVar8 & 0xff];
      uVar7 = (ulong)crc_braid_table[0][(uint)uVar2 & 0xff];
      uVar13 = (ulong)crc_braid_table[0][(uint)uVar15 & 0xff];
      bVar3 = 8;
      for (lVar6 = 0; lVar6 != 0x1c00; lVar6 = lVar6 + 0x400) {
        uVar11 = uVar11 ^ *(uint *)(lVar6 + (ulong)((uint)(uVar4 >> (bVar3 & 0x3f)) & 0xff) * 4 +
                                            0x133330);
        uVar14 = uVar14 ^ *(uint *)(lVar6 + (ulong)((uint)(uVar12 >> (bVar3 & 0x3f)) & 0xff) * 4 +
                                            0x133330);
        uVar16 = uVar16 ^ *(uint *)(lVar6 + (ulong)((uint)(uVar8 >> (bVar3 & 0x3f)) & 0xff) * 4 +
                                            0x133330);
        uVar7 = uVar7 ^ *(uint *)(lVar6 + (ulong)((uint)(uVar2 >> (bVar3 & 0x3f)) & 0xff) * 4 +
                                          0x133330);
        uVar13 = uVar13 ^ *(uint *)(lVar6 + (ulong)((uint)(uVar15 >> (bVar3 & 0x3f)) & 0xff) * 4 +
                                            0x133330);
        bVar3 = bVar3 + 8;
      }
      puVar5 = puVar5 + 5;
    }
    len = len % 0x28;
    uVar9 = crc_word(uVar11 ^ *puVar5);
    uVar9 = crc_word((ulong)uVar9 ^ puVar5[1] ^ uVar14);
    uVar9 = crc_word((ulong)uVar9 ^ puVar5[2] ^ uVar16);
    uVar9 = crc_word((ulong)uVar9 ^ puVar5[3] ^ uVar7);
    uVar9 = crc_word((ulong)uVar9 ^ puVar5[4] ^ uVar13);
    buf = (uint8_t *)(puVar5 + 5);
  }
  for (; 7 < len; len = len - 8) {
    uVar10 = uVar9 >> 8 ^ crc_table[(byte)((byte)*(ulong *)buf ^ (byte)uVar9)];
    uVar10 = uVar10 >> 8 ^ crc_table[(byte)(*(byte *)((long)buf + 1) ^ (byte)uVar10)];
    uVar10 = uVar10 >> 8 ^ crc_table[(byte)(*(byte *)((long)buf + 2) ^ (byte)uVar10)];
    uVar10 = uVar10 >> 8 ^ crc_table[(byte)(*(byte *)((long)buf + 3) ^ (byte)uVar10)];
    uVar10 = uVar10 >> 8 ^ crc_table[(byte)(*(byte *)((long)buf + 4) ^ (byte)uVar10)];
    uVar10 = uVar10 >> 8 ^ crc_table[(byte)(*(byte *)((long)buf + 5) ^ (byte)uVar10)];
    uVar10 = uVar10 >> 8 ^ crc_table[(byte)(*(byte *)((long)buf + 6) ^ (byte)uVar10)];
    uVar9 = uVar10 >> 8 ^ crc_table[(byte)(*(byte *)((long)buf + 7) ^ (byte)uVar10)];
    buf = (uint8_t *)((long)buf + 8);
  }
  for (uVar1 = 0; len != uVar1; uVar1 = uVar1 + 1) {
    uVar9 = uVar9 >> 8 ^ crc_table[(byte)(*(byte *)((long)buf + uVar1) ^ (byte)uVar9)];
  }
  return ~uVar9;
}

Assistant:

Z_INTERNAL uint32_t PREFIX(crc32_braid)(uint32_t crc, const uint8_t *buf, size_t len) {
    uint32_t c;

    /* Pre-condition the CRC */
    c = (~crc) & 0xffffffff;

#ifdef W
    /* If provided enough bytes, do a braided CRC calculation. */
    if (len >= N * W + W - 1) {
        size_t blks;
        z_word_t const *words;
        int k;

        /* Compute the CRC up to a z_word_t boundary. */
        while (len && ((uintptr_t)buf & (W - 1)) != 0) {
            len--;
            DO1;
        }

        /* Compute the CRC on as many N z_word_t blocks as are available. */
        blks = len / (N * W);
        len -= blks * N * W;
        words = (z_word_t const *)buf;

        z_word_t crc0, word0, comb;
#if N > 1
        z_word_t crc1, word1;
#if N > 2
        z_word_t crc2, word2;
#if N > 3
        z_word_t crc3, word3;
#if N > 4
        z_word_t crc4, word4;
#if N > 5
        z_word_t crc5, word5;
#endif
#endif
#endif
#endif
#endif
        /* Initialize the CRC for each braid. */
        crc0 = ZSWAPWORD(c);
#if N > 1
        crc1 = 0;
#if N > 2
        crc2 = 0;
#if N > 3
        crc3 = 0;
#if N > 4
        crc4 = 0;
#if N > 5
        crc5 = 0;
#endif
#endif
#endif
#endif
#endif
        /* Process the first blks-1 blocks, computing the CRCs on each braid independently. */
        while (--blks) {
            /* Load the word for each braid into registers. */
            word0 = crc0 ^ words[0];
#if N > 1
            word1 = crc1 ^ words[1];
#if N > 2
            word2 = crc2 ^ words[2];
#if N > 3
            word3 = crc3 ^ words[3];
#if N > 4
            word4 = crc4 ^ words[4];
#if N > 5
            word5 = crc5 ^ words[5];
#endif
#endif
#endif
#endif
#endif
            words += N;

            /* Compute and update the CRC for each word. The loop should get unrolled. */
            crc0 = BRAID_TABLE[0][word0 & 0xff];
#if N > 1
            crc1 = BRAID_TABLE[0][word1 & 0xff];
#if N > 2
            crc2 = BRAID_TABLE[0][word2 & 0xff];
#if N > 3
            crc3 = BRAID_TABLE[0][word3 & 0xff];
#if N > 4
            crc4 = BRAID_TABLE[0][word4 & 0xff];
#if N > 5
            crc5 = BRAID_TABLE[0][word5 & 0xff];
#endif
#endif
#endif
#endif
#endif
            for (k = 1; k < W; k++) {
                crc0 ^= BRAID_TABLE[k][(word0 >> (k << 3)) & 0xff];
#if N > 1
                crc1 ^= BRAID_TABLE[k][(word1 >> (k << 3)) & 0xff];
#if N > 2
                crc2 ^= BRAID_TABLE[k][(word2 >> (k << 3)) & 0xff];
#if N > 3
                crc3 ^= BRAID_TABLE[k][(word3 >> (k << 3)) & 0xff];
#if N > 4
                crc4 ^= BRAID_TABLE[k][(word4 >> (k << 3)) & 0xff];
#if N > 5
                crc5 ^= BRAID_TABLE[k][(word5 >> (k << 3)) & 0xff];
#endif
#endif
#endif
#endif
#endif
            }
        }

        /* Process the last block, combining the CRCs of the N braids at the same time. */
        comb = crc_word(crc0 ^ words[0]);
#if N > 1
        comb = crc_word(crc1 ^ words[1] ^ comb);
#if N > 2
        comb = crc_word(crc2 ^ words[2] ^ comb);
#if N > 3
        comb = crc_word(crc3 ^ words[3] ^ comb);
#if N > 4
        comb = crc_word(crc4 ^ words[4] ^ comb);
#if N > 5
        comb = crc_word(crc5 ^ words[5] ^ comb);
#endif
#endif
#endif
#endif
#endif
        words += N;
        Assert(comb <= UINT32_MAX, "comb should fit in uint32_t");
        c = (uint32_t)ZSWAPWORD(comb);

        /* Update the pointer to the remaining bytes to process. */
        buf = (const unsigned char *)words;
    }

#endif /* W */

    /* Complete the computation of the CRC on any remaining bytes. */
    while (len >= 8) {
        len -= 8;
        DO8;
    }
    while (len) {
        len--;
        DO1;
    }

    /* Return the CRC, post-conditioned. */
    return c ^ 0xffffffff;
}